

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void testBase32(void)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  int iVar9;
  Array<char,_axl::sl::ArrayDetails<char>_> dec;
  Array<char,_axl::sl::ArrayDetails<char>_> source;
  String enc;
  String enc_1;
  Array<char,_axl::sl::ArrayDetails<char>_> dec_1;
  char s [81];
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_120;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_108;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_e8;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_c0;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_a0;
  char local_88 [80];
  undefined1 local_38;
  
  pcVar6 = "NB2WSLBAM5XXM3TPEBUSA3LVOJQXMZLJFQQG25LSMF3GK2JMEBTW65TON4QGSIDIOVUSCIJBEE======";
  pcVar7 = local_88;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)pcVar7 = *(undefined8 *)pcVar6;
    pcVar6 = pcVar6 + 8;
    pcVar7 = pcVar7 + 8;
  }
  local_38 = 0;
  local_e8.m_length._0_1_ = 0;
  local_e8.m_length._1_7_ = 0;
  local_e8.m_isNullTerminated = false;
  local_e8.m_p = (C *)0x0;
  local_e8.m_hdr._0_1_ = 0;
  local_e8.m_hdr._1_7_ = 0;
  sVar3 = strlen(local_88);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
            (&local_e8,(BufHdr *)0x0);
  local_e8.m_length._0_1_ = (undefined1)sVar3;
  local_e8.m_length._1_7_ = (undefined7)(sVar3 >> 8);
  local_e8.m_isNullTerminated = true;
  local_e8.m_p = local_88;
  axl::enc::Base32Encoding::decode
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)&local_120,&local_e8);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_e8);
  sVar8 = local_120.m_count;
  bVar1 = axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::
          setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>
                    ((Array<char,_axl::sl::ArrayDetails<char>_> *)&local_120,local_120.m_count + 1);
  pcVar6 = local_120.m_p;
  if (bVar1) {
    if (local_120.m_p == (char *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      local_120.m_p[sVar8] = '\0';
    }
  }
  printf("decoded: %s\n",pcVar6);
  axl::enc::Base32Encoding::encode((String *)&local_e8,local_120.m_p,local_120.m_count - 1,0);
  pcVar6 = local_e8.m_p;
  if (CONCAT71(local_e8.m_length._1_7_,(undefined1)local_e8.m_length) == 0) {
    pcVar6 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  }
  iVar9 = 0;
  printf("encoded: %s\n",pcVar6);
  printf("orginal: %s\n",local_88);
  local_108.m_p = (char *)0x0;
  local_108.m_hdr = (Hdr *)0x0;
  local_108.m_count = 0;
  do {
    iVar2 = rand();
    iVar2 = iVar2 % 0x40 + 0x10;
    sVar8 = (size_t)iVar2;
    axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::
    setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>
              ((Array<char,_axl::sl::ArrayDetails<char>_> *)&local_108,sVar8);
    bVar1 = axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::ensureExclusive
                      ((Array<char,_axl::sl::ArrayDetails<char>_> *)&local_108);
    pcVar6 = (char *)0x0;
    if (bVar1) {
      pcVar6 = local_108.m_p;
    }
    if (iVar2 != 0) {
      sVar5 = 0;
      do {
        iVar2 = rand();
        pcVar6[sVar5] = (char)iVar2;
        sVar5 = sVar5 + 1;
      } while (sVar8 != sVar5);
    }
    axl::enc::Base32Encoding::encode((String *)&local_c0,local_108.m_p,sVar8,0);
    axl::enc::Base32Encoding::decode
              ((Array<char,_axl::sl::ArrayDetails<char>_> *)&local_a0,&local_c0);
    axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::release(&local_a0);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_c0);
    iVar9 = iVar9 + 1;
  } while (iVar9 != 500);
  axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::release(&local_108);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_e8);
  axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::release(&local_120);
  return;
}

Assistant:

void
testBase32() {
	char s[] = "NB2WSLBAM5XXM3TPEBUSA3LVOJQXMZLJFQQG25LSMF3GK2JMEBTW65TON4QGSIDIOVUSCIJBEE======";

	sl::Array<char> dec = enc::Base32Encoding::decode(s);
	dec.append(0);
	printf("decoded: %s\n", dec.cp());

	sl::String enc = enc::Base32Encoding::encode(dec, dec.getCount() - 1);
	printf("encoded: %s\n", enc.sz());
	printf("orginal: %s\n", s);
	ASSERT(enc == s);

	sl::Array<char> source;


	for (int i = 0; i < 500; i++) {
		size_t size = rand() % 64 + 16;
		source.setCount(size);
		sl::Array<char>::Rwi rwi = source;

		for (size_t j = 0; j < size; j++)
			rwi[j] = (char)rand();

		sl::String enc = enc::Base32Encoding::encode(source, size);
		sl::Array<char> dec = enc::Base32Encoding::decode(enc);
		ASSERT(dec.getCount() == size && memcmp(dec, source, size) == 0);
	}
}